

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

void __thiscall WScriptJsrt::CallbackMessage::~CallbackMessage(CallbackMessage *this)

{
  code *pcVar1;
  JsErrorCode JVar2;
  PAL_FILE *pPVar3;
  bool local_19 [8];
  bool hasException;
  
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__CallbackMessage_00188358;
  local_19[0] = false;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtHasException)(local_19);
  if (local_19[0] == true) {
    PrintException("",JsErrorScriptException,(JsValueRef)0x0);
  }
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(this->m_function,(uint *)0x0);
  if (JVar2 == JsNoError) {
    this->m_function = (JsValueRef)0x0;
    return;
  }
  pPVar3 = PAL_get_stderr(0);
  PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp"
              ,0x7b6,"errorCode == JsNoError","errorCode == JsNoError");
  pPVar3 = PAL_get_stderr(0);
  PAL_fflush(pPVar3);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

WScriptJsrt::CallbackMessage::~CallbackMessage()
{
    bool hasException = false;
    ChakraRTInterface::JsHasException(&hasException);
    if (hasException)
    {
        WScriptJsrt::PrintException("", JsErrorScriptException);
    }
    JsErrorCode errorCode = ChakraRTInterface::JsRelease(m_function, nullptr);
    Assert(errorCode == JsNoError);
    m_function = JS_INVALID_REFERENCE;
}